

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O0

int __thiscall Net::predict(Net *this,Table *input)

{
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  double dVar4;
  int local_28;
  int local_24;
  int i;
  int maxx;
  int layer;
  int x;
  Table *input_local;
  Net *this_local;
  
  maxx = 0;
  while( true ) {
    pvVar1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,0);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar1);
    if (sVar2 <= (ulong)(long)maxx) break;
    dVar4 = Table::get_value(input,maxx,0);
    pvVar1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,0);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)maxx);
    *pvVar3 = dVar4;
    maxx = maxx + 1;
  }
  i = 1;
  while( true ) {
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->mesh);
    if ((int)sVar2 <= i) break;
    propagate_front(this,i);
    i = i + 1;
  }
  local_24 = 0;
  local_28 = 0;
  while( true ) {
    pvVar1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::back(&this->mesh);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar1);
    if (sVar2 <= (ulong)(long)local_28) break;
    pvVar1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::back(&this->mesh);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_24);
    dVar4 = *pvVar3;
    pvVar1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::back(&this->mesh);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)local_28);
    if (dVar4 < *pvVar3) {
      local_24 = local_28;
    }
    local_28 = local_28 + 1;
  }
  return local_24;
}

Assistant:

int Net::predict(Table input){
    for (int x = 0; x < mesh[0].size(); ++x)
        mesh[0][x] = input.get_value(x, 0);
    for (int layer = 1; layer < (int)mesh.size(); ++layer)
        propagate_front(layer);

    int maxx = 0;
    for (int i = 0; i < mesh.back().size(); ++i)
        if (mesh.back()[maxx] < mesh.back()[i]) maxx = i;
    return maxx;
}